

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

LogicalExpr * __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,mp::internal::VarBoundHandler<ExprPrinter>>
::ReadLogicalExpr_abi_cxx11_
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
           *this)

{
  char cVar1;
  BinaryReaderBase *this_00;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
  *in_RSI;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
  *in_RDI;
  char c;
  int in_stack_000002b4;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
  *in_stack_000002b8;
  NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
  *this_01;
  CStringRef in_stack_ffffffffffffffe0;
  
  this_01 = in_RDI;
  cVar1 = ReaderBase::ReadChar((ReaderBase *)in_RSI->reader_);
  this_00 = (BinaryReaderBase *)(ulong)((int)cVar1 - 0x6c);
  switch(this_00) {
  case (BinaryReaderBase *)0x0:
  case (BinaryReaderBase *)0x2:
  case (BinaryReaderBase *)0x7:
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
    ::ReadConstant(in_RSI,(char)((ulong)this_01 >> 0x38));
    NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::OnBool((NLHandler<mp::NullNLHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_01,SUB81((ulong)in_RDI >> 0x38,0));
    break;
  default:
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffe0,"expected logical expression");
    BinaryReaderBase::ReportError<>(this_00,in_stack_ffffffffffffffe0);
    std::__cxx11::string::string((string *)in_RDI);
    break;
  case (BinaryReaderBase *)0x3:
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<ExprPrinter>_>
    ::ReadOpCode(in_RDI);
    ReadLogicalExpr_abi_cxx11_(in_stack_000002b8,in_stack_000002b4);
  }
  return (LogicalExpr *)this_01;
}

Assistant:

typename Handler::LogicalExpr NLReader<Reader, Handler>::ReadLogicalExpr() {
  switch (char c = reader_.ReadChar()) {
  case 'n': case 'l': case 's':
    return handler_.OnBool(ReadConstant(c) != 0);
  case 'o':
    return ReadLogicalExpr(ReadOpCode());
  }
  reader_.ReportError("expected logical expression");
  return LogicalExpr();
}